

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O0

int do_lea(void)

{
  uint *puVar1;
  byte bVar2;
  byte bVar3;
  undefined4 *puVar4;
  byte bVar5;
  uint *R_2;
  uint temp_2;
  int16_t *R_1;
  uint temp_1;
  char *R;
  uint temp;
  uint *Rb_2;
  uint *Ra_2;
  int16_t *Rb_1;
  int16_t *Ra_1;
  char *Rb;
  char *Ra;
  uint8_t highb;
  uint8_t low;
  uint8_t high;
  
  bVar2 = (byte)code_ptr[registe_ptr->IP + 2] >> 4;
  bVar5 = code_ptr[registe_ptr->IP + 2] & 0xf;
  if (code_ptr[registe_ptr->IP + 1] == '\0') {
    bVar3 = (byte)code_ptr[registe_ptr->IP + 3] / 0x10;
    if (bVar5 == 0) {
      *(char *)register_list[bVar2] = (char)*register_list[bVar3];
    }
    else if (bVar5 == 1) {
      *(short *)register_list[bVar2] = (short)*register_list[bVar3];
    }
    else if (bVar5 == 2) {
      *register_list[bVar2] = *register_list[bVar3];
    }
  }
  else {
    if (code_ptr[registe_ptr->IP + 1] != '\x01') {
      puVar4 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar4 = 0xf6;
      __cxa_throw(puVar4,&int::typeinfo,0);
    }
    if (bVar5 == 0) {
      puVar1 = register_list[bVar2];
      *(char *)puVar1 = code_ptr[registe_ptr->IP + 3];
      set_flag((char)*puVar1);
    }
    else if (bVar5 == 1) {
      puVar1 = register_list[bVar2];
      *(int16_t *)puVar1 = *(int16_t *)(code_ptr + (ulong)registe_ptr->IP + 3);
      set_flag((int16_t)*puVar1);
    }
    else {
      if (bVar5 != 2) {
        puVar4 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar4 = 0xf6;
        __cxa_throw(puVar4,&int::typeinfo,0);
      }
      puVar1 = register_list[bVar2];
      *puVar1 = *(uint *)(code_ptr + (ulong)registe_ptr->IP + 3);
      set_flag(*puVar1);
    }
  }
  return 1;
}

Assistant:

int do_lea() {
	uint8_t high = (uint8_t)code_ptr[registe_ptr->IP + 2] / 0x10;
	uint8_t low = (uint8_t)code_ptr[registe_ptr->IP + 2] % 0x10;
	switch (code_ptr[registe_ptr->IP + 1])//操作类型
	{
	case '\x00': {
		//
		uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 3] / 0x10;
		if (low == 0) {
			char*Ra = (char *)register_list[high];
			char*Rb = (char*)register_list[highb];
			*Ra = *Rb;
			break;
		}
		else if (low == 1)
		{
			int16_t*Ra = (int16_t *)register_list[high];
			int16_t*Rb = (int16_t *)register_list[highb];
			*Ra = *Rb;
			break;
		}
		else if (low == 2)
		{
			unsigned*Ra = (unsigned *)register_list[high];
			unsigned*Rb = (unsigned*)register_list[highb];
			*Ra = *Rb;
			break;
		}
		break;
	}
	case '\x01': {//
		if (low == 0)//低位运算
		{
			unsigned temp = code_ptr[registe_ptr->IP + 2 + 1];//获得立即数
			char *R = (char *)register_list[high];
			*R = temp;
			set_flag(*R);
			break;
		}
		else if (low == 1)//高位运算
		{
			unsigned temp = *(short*)(code_ptr+registe_ptr->IP + 2 + 1);//获得立即数
			int16_t *R = (int16_t *)register_list[high];
			*R = temp;
			set_flag(*R);
			break;
		}
		else if (low == 2)//全运算
		{
			unsigned temp = *(unsigned*)(code_ptr+registe_ptr->IP + 2 + 1);//获得立即数
			unsigned *R = (unsigned *)register_list[high];
			*R = temp;
			set_flag(*R);
			break;
		}
		else throw(LVM_EXECUTE_ERROR);
		break;
	}
	default: {
		throw(LVM_EXECUTE_ERROR);
		break;
	}
	}
	return LVM_SUCCESS;
}